

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler_test.cpp
# Opt level: O2

void test_absolute_time(void)

{
  uint64_t uVar1;
  LockstepScheduler ls;
  
  ls.timed_waits_mutex_.super___mutex_base._M_mutex.__size[0x20] = '\0';
  ls._65_8_ = 0;
  ls.timed_waits_mutex_.super___mutex_base._M_mutex._16_8_ = 0;
  ls.timed_waits_mutex_.super___mutex_base._M_mutex.__size[0x18] = '\0';
  ls.timed_waits_mutex_.super___mutex_base._M_mutex._25_7_ = 0;
  ls.timed_waits_mutex_.super___mutex_base._M_mutex.__align = 0;
  ls.timed_waits_mutex_.super___mutex_base._M_mutex._8_8_ = 0;
  ls.timed_waits_.
  super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ls.timed_waits_.
  super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ls.time_us_.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  ls.timed_waits_.
  super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  LockstepScheduler::set_absolute_time(&ls,0xbc614e);
  uVar1 = LockstepScheduler::get_absolute_time(&ls);
  if (uVar1 == 0xbc614e) {
    std::
    vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
    ::~vector(&ls.timed_waits_);
    return;
  }
  __assert_fail("ls.get_absolute_time() == some_time_us",
                "/workspace/llm4binary/github/license_all_cmakelists_25/julianoes[P]lockstep-scheduler/test/src/lockstep_scheduler_test.cpp"
                ,0xf,"void test_absolute_time()");
}

Assistant:

void test_absolute_time()
{
    LockstepScheduler ls;
    ls.set_absolute_time(some_time_us);
    assert(ls.get_absolute_time() == some_time_us);
}